

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O0

void emitter_json_object_kv_begin(emitter_t *emitter,char *json_key)

{
  emitter_t *in_RSI;
  char *in_stack_ffffffffffffffe8;
  
  emitter_json_key(in_RSI,in_stack_ffffffffffffffe8);
  emitter_json_object_begin((emitter_t *)0x2590a7);
  return;
}

Assistant:

static inline void
emitter_json_object_kv_begin(emitter_t *emitter, const char *json_key) {
	emitter_json_key(emitter, json_key);
	emitter_json_object_begin(emitter);
}